

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int db_sethook(lua_State *L)

{
  int idx;
  uint uVar1;
  int iVar2;
  int iVar3;
  lua_State *L1;
  char *pcVar4;
  lua_Integer lVar5;
  char *pcVar6;
  char *pcVar7;
  code *func;
  uint uVar8;
  int arg;
  int local_34;
  
  L1 = getthread(L,&local_34);
  idx = local_34 + 1;
  iVar2 = lua_type(L,idx);
  if (iVar2 < 1) {
    lua_settop(L,idx);
    func = (lua_Hook)0x0;
    iVar2 = 0;
    uVar8 = 0;
  }
  else {
    pcVar4 = luaL_checklstring(L,local_34 + 2,(size_t *)0x0);
    luaL_checktype(L,idx,6);
    lVar5 = luaL_optinteger(L,local_34 + 3,0);
    pcVar6 = strchr(pcVar4,99);
    pcVar7 = strchr(pcVar4,0x72);
    uVar8 = (pcVar6 != (char *)0x0) + 2;
    if (pcVar7 == (char *)0x0) {
      uVar8 = (uint)(pcVar6 != (char *)0x0);
    }
    pcVar4 = strchr(pcVar4,0x6c);
    uVar1 = uVar8 + 4;
    if (pcVar4 == (char *)0x0) {
      uVar1 = uVar8;
    }
    iVar2 = (int)lVar5;
    uVar8 = uVar1 + 8;
    if (iVar2 < 1) {
      uVar8 = uVar1;
    }
    func = hookf;
  }
  iVar3 = luaL_getsubtable(L,-0xf4628,"_HKEY");
  if (iVar3 == 0) {
    lua_pushstring(L,"k");
    lua_setfield(L,-2,"__mode");
    lua_pushvalue(L,-1);
    lua_setmetatable(L,-2);
  }
  checkstack(L,L1,1);
  lua_pushthread(L1);
  lua_xmove(L1,L,1);
  lua_pushvalue(L,idx);
  lua_rawset(L,-3);
  lua_sethook(L1,func,uVar8,iVar2);
  return 0;
}

Assistant:

static int db_sethook (lua_State *L) {
  int arg, mask, count;
  lua_Hook func;
  lua_State *L1 = getthread(L, &arg);
  if (lua_isnoneornil(L, arg+1)) {
    lua_settop(L, arg+1);
    func = NULL; mask = 0; count = 0;  /* turn off hooks */
  }
  else {
    const char *smask = luaL_checkstring(L, arg+2);
    luaL_checktype(L, arg+1, LUA_TFUNCTION);
    count = luaL_optint(L, arg+3, 0);
    func = hookf; mask = makemask(smask, count);
  }
  if (gethooktable(L) == 0) {  /* creating hook table? */
    lua_pushstring(L, "k");
    lua_setfield(L, -2, "__mode");  /** hooktable.__mode = "k" */
    lua_pushvalue(L, -1);
    lua_setmetatable(L, -2);  /* setmetatable(hooktable) = hooktable */
  }
  checkstack(L, L1, 1);
  lua_pushthread(L1); lua_xmove(L1, L, 1);
  lua_pushvalue(L, arg+1);
  lua_rawset(L, -3);  /* set new hook */
  lua_sethook(L1, func, mask, count);  /* set hooks */
  return 0;
}